

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.cpp
# Opt level: O3

void __thiscall Am_String_Data::Print(Am_String_Data *this,ostream *out)

{
  char *__s;
  size_t sVar1;
  
  __s = this->value;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar1);
    return;
  }
  std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  return;
}

Assistant:

void
Am_String_Data::Print(std::ostream &out) const
{
  out << value;
}